

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statemachine.cpp
# Opt level: O2

MetaConfiguration * parse_configuration(MetaConfiguration *__return_storage_ptr__,ifstream *f)

{
  int error;
  callback_t state;
  int local_94;
  code *local_90 [2];
  _Manager_type local_80;
  code *local_78;
  function<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>
  local_70;
  function<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>
  local_50;
  
  (__return_storage_ptr__->includes).super__Vector_base<MetaInclude,_std::allocator<MetaInclude>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->top_level_class).
  super___shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (__return_storage_ptr__->includes).super__Vector_base<MetaInclude,_std::allocator<MetaInclude>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->includes).super__Vector_base<MetaInclude,_std::allocator<MetaInclude>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->top_level_class).
  super___shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__return_storage_ptr__->conf_namespace)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->conf_namespace).field_2;
  (__return_storage_ptr__->conf_namespace)._M_string_length = 0;
  (__return_storage_ptr__->conf_namespace).field_2._M_local_buf[0] = '\0';
  local_90[1] = (code *)0x0;
  local_90[0] = initial_state;
  local_78 = std::
             _Function_handler<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&),_std::function<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>_(*)(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>
             ::_M_invoke;
  local_80 = std::
             _Function_handler<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&),_std::function<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>_(*)(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>
             ::_M_manager;
  while (local_80 != (_Manager_type)0x0) {
    std::
    function<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>
    ::operator()((RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>
                  *)&local_70,
                 (function<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>
                  *)local_90,__return_storage_ptr__,f,&local_94);
    std::
    function<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>
    ::function(&local_50,&local_70);
    std::
    function<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>
    ::operator=((function<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>
                 *)local_90,&local_50);
    std::_Function_base::~_Function_base(&local_50.super__Function_base);
    std::_Function_base::~_Function_base(&local_70.super__Function_base);
  }
  std::_Function_base::~_Function_base((_Function_base *)local_90);
  return __return_storage_ptr__;
}

Assistant:

MetaConfiguration parse_configuration(std::ifstream &f) {
  int error;
  MetaConfiguration conf;
  callback_t state = initial_state;
  while (state) {
    state = state(conf, f, error);
  }
  return conf;
}